

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemoassemble.cc
# Opt level: O0

Matrix<double,_3,_3,_0,_3,_3> * __thiscall
lecturedemo::LinFELaplaceElemMatProvider::Eval
          (Matrix<double,_3,_3,_0,_3,_3> *__return_storage_ptr__,LinFELaplaceElemMatProvider *this,
          Entity *tria)

{
  RefElType RVar1;
  RefElType RVar2;
  int iVar3;
  runtime_error *this_00;
  undefined4 extraout_var;
  Index IVar4;
  ostream *poVar5;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_01;
  double extraout_XMM0_Qa;
  non_const_type local_640;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_2,_1,_3,_2>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>
  local_638;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_2,_1,_3,_2>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>
  local_610;
  XprTypeNested local_5e0;
  Type local_5d8;
  Matrix<double,2,3,0,2,3> local_5b8 [8];
  Matrix<double,_2,_3,_0,_2,_3> grad_bary_coords;
  double local_580;
  double area;
  non_const_type local_548;
  Type local_540;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_510 [16];
  undefined1 local_500 [8];
  Matrix<double,_3,_3,_0,_3,_3> X;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  stringstream local_3d0 [8];
  stringstream ss_1;
  ostream local_3c0 [376];
  undefined1 local_248 [8];
  MatrixXd vertices;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  RefEl local_1bd [13];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [382];
  RefEl local_22;
  RefEl local_21;
  Entity *local_20;
  Entity *tria_local;
  LinFELaplaceElemMatProvider *this_local;
  
  local_20 = tria;
  tria_local = (Entity *)this;
  this_local = (LinFELaplaceElemMatProvider *)__return_storage_ptr__;
  iVar3 = (*tria->_vptr_Entity[4])();
  local_21.type_ = (RefElType)iVar3;
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_21);
  local_22 = lf::base::RefEl::kTria();
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_22);
  if (RVar1 != RVar2) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar5 = std::operator<<(local_1a0,"Unsupported cell type ");
    iVar3 = (*local_20->_vptr_Entity[4])();
    local_1bd[0].type_ = (RefElType)iVar3;
    lf::base::operator<<(poVar5,local_1bd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"tria.RefEl() == lf::base::RefEl::kTria()",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemoassemble.cc"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed
              (&local_1e0,&local_208,0x16,
               (string *)
               &vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
    std::__cxx11::string::~string
              ((string *)
               &vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (*local_20->_vptr_Entity[3])();
  lf::geometry::Corners((MatrixXd *)local_248,(Geometry *)CONCAT44(extraout_var,iVar3));
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_248);
  if (IVar4 == 3) {
    IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_248);
    if (IVar4 == 2) {
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_500);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Ones();
      Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<3,1>(&local_540,local_500,0,0);
      Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,false>::operator=
                ((Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,false> *)&local_540,local_510);
      local_548 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_248);
      Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<3,2>((Type *)&area,local_500,0,1);
      Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,2,false>::operator=
                ((Block<Eigen::Matrix<double,3,3,0,3,3>,3,2,false> *)&area,
                 (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                 &local_548);
      this_01 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_500;
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant(this_01);
      std::abs((int)this_01);
      local_580 = extraout_XMM0_Qa * 0.5;
      local_5e0 = (XprTypeNested)
                  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse
                            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_500);
      Eigen::DenseBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>>::block<2,3>
                (&local_5d8,&local_5e0,1,0);
      Eigen::Matrix<double,2,3,0,2,3>::
      Matrix<Eigen::Block<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>const,2,3,false>>
                (local_5b8,&local_5d8);
      local_640 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_5b8);
      Eigen::operator*(&local_638,&local_580,(StorageBaseType *)&local_640);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,2,1,3,2>const>const,Eigen::Transpose<Eigen::Matrix<double,2,3,0,2,3>>const>>
      ::operator*(&local_610,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,2,1,3,2>const>const,Eigen::Transpose<Eigen::Matrix<double,2,3,0,2,3>>const>>
                   *)&local_638,(MatrixBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_5b8);
      Eigen::Matrix<double,3,3,0,3,3>::
      Matrix<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,2,1,3,2>const>const,Eigen::Transpose<Eigen::Matrix<double,2,3,0,2,3>>const>,Eigen::Matrix<double,2,3,0,2,3>,0>>
                ((Matrix<double,3,3,0,3,3> *)__return_storage_ptr__,
                 (EigenBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_2,_1,_3,_2>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>_>
                  *)&local_610);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_248);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::stringstream::stringstream(local_3d0);
  poVar5 = std::operator<<(local_3c0,"Invalid vertex coordinate ");
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_248);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,IVar4);
  poVar5 = std::operator<<(poVar5,"x");
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_248);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,IVar4);
  std::operator<<(poVar5," matrix");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"(vertices.cols() == 3) && (vertices.rows() == 2)",&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemoassemble.cc"
             ,&local_419);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_3f0,&local_418,0x1b,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"false",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemoassemble.cc"
             ,&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"",
             (allocator<char> *)
             ((long)X.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x47));
  lf::base::AssertionFailed(&local_460,&local_488,0x1b,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)X.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x47));
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  abort();
}

Assistant:

Eigen::Matrix<double, 3, 3> LinFELaplaceElemMatProvider::Eval( // NOLINT
    const lf::mesh::Entity &tria) {
    // Throw error in case no triangular cell
    LF_VERIFY_MSG(tria.RefEl() == lf::base::RefEl::kTria(),
		  "Unsupported cell type " << tria.RefEl());
    // Obtain vertex coordinates of the triangle in a 2x3 matrix
    const auto vertices = lf::geometry::Corners(*(tria.Geometry()));
    LF_ASSERT_MSG((vertices.cols() == 3) && (vertices.rows() == 2),
		  "Invalid vertex coordinate " << vertices.rows() << "x"
		  << vertices.cols() << " matrix");

    // Set up an auxiliary 3x3-matrix with a leading column 1 and
    // the vertex coordinates in its right 3x2 block
    Eigen::Matrix<double, 3, 3> X;  // temporary matrix
    X.block<3, 1>(0, 0) = Eigen::Vector3d::Ones();
    X.block<3, 2>(0, 1) = vertices.transpose();
    // The determinant of the auxiliary matrix also supplies the determinant
    const double area = 0.5 * std::abs(X.determinant());
    // Compute the gradients of the barycentric coordinate functions
    // and store them in the columns of a 2x3 matrix grad\_bary\_coords
    Eigen::Matrix<double, 2, 3>
      grad_bary_coords{X.inverse().block<2, 3>(1, 0)};

    // Since the gradients are constant, local integration is easy
    return ((area * grad_bary_coords.transpose()) * grad_bary_coords);
  }